

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O3

int mbedtls_aes_setkey_enc(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  uint3 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint8_t pow [256];
  byte abStack_238 [256];
  byte abStack_138 [264];
  
  if (keybits == 0x80) {
    iVar5 = 10;
  }
  else if (keybits == 0x100) {
    iVar5 = 0xe;
  }
  else {
    if (keybits != 0xc0) {
      return -0x20;
    }
    iVar5 = 0xc;
  }
  ctx->nr = iVar5;
  if (aes_init_done == '\x01') {
    ctx->rk_offset = 0;
  }
  else {
    uVar6 = 1;
    lVar7 = 0;
    do {
      bVar2 = (byte)uVar6;
      abStack_138[lVar7] = bVar2;
      abStack_238[uVar6] = (byte)lVar7;
      uVar6 = (ulong)(byte)((char)bVar2 >> 7 & 0x1bU ^ bVar2 * '\x02' ^ bVar2);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x100);
    uVar8 = 1;
    lVar7 = 0;
    do {
      *(uint *)((long)round_constants + lVar7) = uVar8 & 0xff;
      uVar8 = (uint)(int)(char)uVar8 >> 7 & 0x1b ^ (uVar8 & 0xff) * 2;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x28);
    FSb[0] = 'c';
    RSb[99] = '\0';
    lVar7 = 1;
    do {
      bVar2 = abStack_138[(ulong)abStack_238[lVar7] ^ 0xff];
      uVar6 = (ulong)(byte)((bVar2 << 2 | bVar2 >> 6) ^ bVar2 ^
                            (bVar2 << 4 | bVar2 >> 4) ^ (bVar2 << 1 | (char)bVar2 < '\0') ^
                           (bVar2 << 3 | bVar2 >> 5)) ^ 99;
      FSb[lVar7] = (uchar)uVar6;
      RSb[uVar6] = (uchar)lVar7;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x100);
    lVar7 = -0x400;
    lVar9 = 0;
    do {
      bVar2 = FSb[lVar9];
      bVar3 = (char)bVar2 >> 7 & 0x1bU ^ bVar2 * '\x02';
      bVar4 = bVar3 ^ bVar2;
      uVar1 = CONCAT12(bVar2,CONCAT11(bVar2,bVar3));
      *(uint *)((long)FT1 + lVar7) = CONCAT13(bVar4,uVar1);
      iVar10 = CONCAT31(uVar1,bVar4);
      *(int *)((long)FT2 + lVar7) = iVar10;
      *(uint *)((long)FT3 + lVar7) = iVar10 << 8 | (uint)bVar2;
      *(uint *)(RSb + lVar7) = iVar10 << 0x10 | (uint)(uVar1 >> 8);
      uVar8 = 0;
      if ((ulong)RSb[lVar9] != 0) {
        bVar2 = abStack_238[RSb[lVar9]];
        uVar8 = CONCAT13(abStack_138[((uint)bVar2 + (uint)abStack_238[0xb]) % 0xff],
                         CONCAT12(abStack_138[((uint)abStack_238[0xd] + (uint)bVar2) % 0xff],
                                  CONCAT11(abStack_138[((uint)abStack_238[9] + (uint)bVar2) % 0xff],
                                           abStack_138
                                           [((uint)abStack_238[0xe] + (uint)bVar2) % 0xff])));
      }
      *(uint *)((long)RT1 + lVar7) = uVar8;
      *(uint *)((long)RT2 + lVar7) = uVar8 << 8 | uVar8 >> 0x18;
      *(uint *)((long)RT3 + lVar7) = uVar8 << 0x10 | uVar8 >> 0x10;
      *(uint *)((long)FT0 + lVar7) = uVar8 << 0x18 | uVar8 >> 8;
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0);
    aes_init_done = '\x01';
    ctx->rk_offset = 0;
    if (keybits < 0x20) goto LAB_01cf6ada;
  }
  uVar6 = 0;
  do {
    ctx->buf[uVar6] = *(uint32_t *)(key + uVar6 * 4);
    uVar6 = uVar6 + 1;
  } while (keybits >> 5 != uVar6);
LAB_01cf6ada:
  iVar5 = (*(code *)(&DAT_01f594b0 + *(int *)(&DAT_01f594b0 + (ulong)(iVar5 - 8) * 4)))
                    (ctx,key,&DAT_01f594b0 + *(int *)(&DAT_01f594b0 + (ulong)(iVar5 - 8) * 4),
                     ctx->buf);
  return iVar5;
}

Assistant:

int mbedtls_aes_setkey_enc(mbedtls_aes_context *ctx, const unsigned char *key,
                           unsigned int keybits)
{
    uint32_t *RK;

    switch (keybits) {
        case 128: ctx->nr = 10; break;
#if !defined(MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH)
        case 192: ctx->nr = 12; break;
        case 256: ctx->nr = 14; break;
#endif /* !MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH */
        default: return MBEDTLS_ERR_AES_INVALID_KEY_LENGTH;
    }

#if !defined(MBEDTLS_AES_ROM_TABLES)
    if (aes_init_done == 0) {
        aes_gen_tables();
        aes_init_done = 1;
    }
#endif

    ctx->rk_offset = mbedtls_aes_rk_offset(ctx->buf);
    RK = ctx->buf + ctx->rk_offset;

#if defined(MBEDTLS_AESNI_HAVE_CODE)
    if (mbedtls_aesni_has_support(MBEDTLS_AESNI_AES)) {
        return mbedtls_aesni_setkey_enc((unsigned char *) RK, key, keybits);
    }
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
    if (MBEDTLS_AESCE_HAS_SUPPORT()) {
        return mbedtls_aesce_setkey_enc((unsigned char *) RK, key, keybits);
    }
#endif

#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    for (unsigned int i = 0; i < (keybits >> 5); i++) {
        RK[i] = MBEDTLS_GET_UINT32_LE(key, i << 2);
    }

    switch (ctx->nr) {
        case 10:

            for (unsigned int i = 0; i < 10; i++, RK += 4) {
                RK[4]  = RK[0] ^ round_constants[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[3])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[3])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[3])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[3])] << 24);

                RK[5]  = RK[1] ^ RK[4];
                RK[6]  = RK[2] ^ RK[5];
                RK[7]  = RK[3] ^ RK[6];
            }
            break;

#if !defined(MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH)
        case 12:

            for (unsigned int i = 0; i < 8; i++, RK += 6) {
                RK[6]  = RK[0] ^ round_constants[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[5])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[5])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[5])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[5])] << 24);

                RK[7]  = RK[1] ^ RK[6];
                RK[8]  = RK[2] ^ RK[7];
                RK[9]  = RK[3] ^ RK[8];
                RK[10] = RK[4] ^ RK[9];
                RK[11] = RK[5] ^ RK[10];
            }
            break;

        case 14:

            for (unsigned int i = 0; i < 7; i++, RK += 8) {
                RK[8]  = RK[0] ^ round_constants[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[7])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[7])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[7])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[7])] << 24);

                RK[9]  = RK[1] ^ RK[8];
                RK[10] = RK[2] ^ RK[9];
                RK[11] = RK[3] ^ RK[10];

                RK[12] = RK[4] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[11])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[11])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[11])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[11])] << 24);

                RK[13] = RK[5] ^ RK[12];
                RK[14] = RK[6] ^ RK[13];
                RK[15] = RK[7] ^ RK[14];
            }
            break;
#endif /* !MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH */
    }

    return 0;
#endif /* !MBEDTLS_AES_USE_HARDWARE_ONLY */
}